

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_audio_chain.cpp
# Opt level: O3

void __thiscall Voice::Voice(Voice *this)

{
  int iVar1;
  ALLEGRO_VOICE *pAVar2;
  
  (this->super_Element).x = 0;
  (this->super_Element).y = 0;
  (this->super_Element).w = 0x28;
  (this->super_Element).h = 0x28;
  (this->super_Element).attached_to = (Element *)0x0;
  (this->super_Element)._vptr_Element = (_func_int **)&PTR__Voice_0010aa10;
  iVar1 = rand();
  (this->super_Element).x = iVar1 % (800 - (this->super_Element).w);
  iVar1 = rand();
  (this->super_Element).y = iVar1 % (600 - (this->super_Element).h);
  pAVar2 = (ALLEGRO_VOICE *)al_create_voice(0xac44,1,0x20);
  this->voice = pAVar2;
  return;
}

Assistant:

Voice::Voice()
{
   set_random_pos();
   voice = al_create_voice(44100, ALLEGRO_AUDIO_DEPTH_INT16,
      ALLEGRO_CHANNEL_CONF_2);
}